

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O1

void __thiscall
glauber::Event::compute(Event *this,Nucleus *nucleusA,Nucleus *nucleusB,NucleonProfile *profile)

{
  this->npart_ = 0;
  compute_nuclear_thickness(this,nucleusA,profile,&this->TA_);
  compute_nuclear_thickness(this,nucleusB,profile,&this->TB_);
  compute_reduced_thickness(this);
  compute_observables(this);
  return;
}

Assistant:

void Event::compute(const Nucleus& nucleusA, const Nucleus& nucleusB,
                    NucleonProfile& profile) {
  // Reset npart; compute_nuclear_thickness() increments it.
  npart_ = 0;
  compute_nuclear_thickness(nucleusA, profile, TA_);
  compute_nuclear_thickness(nucleusB, profile, TB_);
  compute_reduced_thickness();
  compute_observables();
}